

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_chars.hpp
# Opt level: O0

boundaries * nlohmann::detail::dtoa_impl::compute_boundaries<double>(double value)

{
  bool bVar1;
  boundaries *in_RDI;
  double in_XMM0_Qa;
  diyfp dVar2;
  diyfp dVar3;
  diyfp dVar4;
  diyfp w_minus;
  diyfp w_plus;
  diyfp m_minus;
  diyfp m_plus;
  bool lower_boundary_is_closer;
  diyfp v;
  bool is_denormal;
  uint64_t F;
  uint64_t E;
  uint64_t bits;
  uint64_t kHiddenBit;
  int kMinExp;
  int kBias;
  int kPrecision;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 uVar5;
  diyfp local_78;
  diyfp local_68;
  byte local_51;
  diyfp local_50;
  undefined1 local_39;
  ulong local_38;
  ulong local_30;
  unsigned_long local_28;
  undefined8 local_20;
  undefined4 local_14;
  undefined4 local_10;
  undefined4 local_c;
  double local_8;
  
  local_8 = in_XMM0_Qa;
  bVar1 = std::isfinite(in_XMM0_Qa);
  if (!bVar1) {
    __assert_fail("std::isfinite(value)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/nlohmann/detail/conversions/to_chars.hpp"
                  ,0xb8,
                  "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
                 );
  }
  if (0.0 < local_8) {
    local_c = 0x35;
    local_10 = 0x433;
    local_14 = 0xfffffbce;
    local_20 = 0x10000000000000;
    local_28 = reinterpret_bits<unsigned_long,double>(local_8);
    local_30 = local_28 >> 0x34;
    local_38 = local_28 & 0xfffffffffffff;
    local_39 = local_30 == 0;
    if ((bool)local_39) {
      diyfp::diyfp(&local_50,local_38,-0x432);
    }
    else {
      diyfp::diyfp(&local_50,local_38 + 0x10000000000000,(uint)(local_28 >> 0x34) - 0x433);
    }
    uVar5 = local_38 == 0 && 1 < local_30;
    local_51 = uVar5;
    diyfp::diyfp(&local_68,local_50.f * 2 + 1,local_50.e + -1);
    if ((local_51 & 1) == 0) {
      diyfp::diyfp(&local_78,local_50.f * 2 - 1,local_50.e + -1);
    }
    else {
      diyfp::diyfp(&local_78,local_50.f * 4 - 1,local_50.e + -2);
    }
    dVar2.e = in_stack_fffffffffffffef8;
    dVar2.f = 0x2de85e;
    dVar2._12_4_ = in_stack_fffffffffffffefc;
    dVar2 = diyfp::normalize(dVar2);
    dVar3 = diyfp::normalize_to((diyfp *)CONCAT17(uVar5,in_stack_ffffffffffffff00),
                                in_stack_fffffffffffffefc);
    dVar4.e = in_stack_fffffffffffffef8;
    dVar4.f = 0x2de8cb;
    dVar4._12_4_ = in_stack_fffffffffffffefc;
    dVar4 = diyfp::normalize(dVar4);
    (in_RDI->w).f = dVar4.f;
    (in_RDI->w).e = dVar4.e;
    (in_RDI->minus).f = dVar3.f;
    (in_RDI->minus).e = dVar3.e;
    (in_RDI->plus).f = dVar2.f;
    (in_RDI->plus).e = dVar2.e;
    return in_RDI;
  }
  __assert_fail("value > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/nlohmann/detail/conversions/to_chars.hpp"
                ,0xb9,
                "boundaries nlohmann::detail::dtoa_impl::compute_boundaries(FloatType) [FloatType = double]"
               );
}

Assistant:

boundaries compute_boundaries(FloatType value)
{
    assert(std::isfinite(value));
    assert(value > 0);

    // Convert the IEEE representation into a diyfp.
    //
    // If v is denormal:
    //      value = 0.F * 2^(1 - bias) = (          F) * 2^(1 - bias - (p-1))
    // If v is normalized:
    //      value = 1.F * 2^(E - bias) = (2^(p-1) + F) * 2^(E - bias - (p-1))

    static_assert(std::numeric_limits<FloatType>::is_iec559,
                  "internal error: dtoa_short requires an IEEE-754 floating-point implementation");

    constexpr int      kPrecision = std::numeric_limits<FloatType>::digits; // = p (includes the hidden bit)
    constexpr int      kBias      = std::numeric_limits<FloatType>::max_exponent - 1 + (kPrecision - 1);
    constexpr int      kMinExp    = 1 - kBias;
    constexpr std::uint64_t kHiddenBit = std::uint64_t{1} << (kPrecision - 1); // = 2^(p-1)

    using bits_type = typename std::conditional<kPrecision == 24, std::uint32_t, std::uint64_t >::type;

    const std::uint64_t bits = reinterpret_bits<bits_type>(value);
    const std::uint64_t E = bits >> (kPrecision - 1);
    const std::uint64_t F = bits & (kHiddenBit - 1);

    const bool is_denormal = E == 0;
    const diyfp v = is_denormal
                    ? diyfp(F, kMinExp)
                    : diyfp(F + kHiddenBit, static_cast<int>(E) - kBias);

    // Compute the boundaries m- and m+ of the floating-point value
    // v = f * 2^e.
    //
    // Determine v- and v+, the floating-point predecessor and successor if v,
    // respectively.
    //
    //      v- = v - 2^e        if f != 2^(p-1) or e == e_min                (A)
    //         = v - 2^(e-1)    if f == 2^(p-1) and e > e_min                (B)
    //
    //      v+ = v + 2^e
    //
    // Let m- = (v- + v) / 2 and m+ = (v + v+) / 2. All real numbers _strictly_
    // between m- and m+ round to v, regardless of how the input rounding
    // algorithm breaks ties.
    //
    //      ---+-------------+-------------+-------------+-------------+---  (A)
    //         v-            m-            v             m+            v+
    //
    //      -----------------+------+------+-------------+-------------+---  (B)
    //                       v-     m-     v             m+            v+

    const bool lower_boundary_is_closer = F == 0 and E > 1;
    const diyfp m_plus = diyfp(2 * v.f + 1, v.e - 1);
    const diyfp m_minus = lower_boundary_is_closer
                          ? diyfp(4 * v.f - 1, v.e - 2)  // (B)
                          : diyfp(2 * v.f - 1, v.e - 1); // (A)

    // Determine the normalized w+ = m+.
    const diyfp w_plus = diyfp::normalize(m_plus);

    // Determine w- = m- such that e_(w-) = e_(w+).
    const diyfp w_minus = diyfp::normalize_to(m_minus, w_plus.e);

    return {diyfp::normalize(v), w_minus, w_plus};
}